

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

int opj_j2k_get_default_thread_count(void)

{
  OPJ_BOOL OVar1;
  int iVar2;
  char *__s1;
  int local_20;
  int local_1c;
  int num_threads;
  int num_cpus;
  char *num_threads_str;
  
  __s1 = getenv("OPJ_NUM_THREADS");
  if ((__s1 == (char *)0x0) || (OVar1 = opj_has_thread_support(), OVar1 == 0)) {
    num_threads_str._4_4_ = 0;
  }
  else {
    local_1c = opj_get_num_cpus();
    iVar2 = strcmp(__s1,"ALL_CPUS");
    num_threads_str._4_4_ = local_1c;
    if (iVar2 != 0) {
      if (local_1c == 0) {
        local_1c = 0x20;
      }
      local_20 = atoi(__s1);
      if (local_20 < 0) {
        local_20 = 0;
      }
      else if (local_20 != local_1c * 2 &&
               SBORROW4(local_20,local_1c * 2) == local_20 + local_1c * -2 < 0) {
        local_20 = local_1c << 1;
      }
      num_threads_str._4_4_ = local_20;
    }
  }
  return num_threads_str._4_4_;
}

Assistant:

static int opj_j2k_get_default_thread_count()
{
    const char* num_threads_str = getenv("OPJ_NUM_THREADS");
    int num_cpus;
    int num_threads;

    if (num_threads_str == NULL || !opj_has_thread_support()) {
        return 0;
    }
    num_cpus = opj_get_num_cpus();
    if (strcmp(num_threads_str, "ALL_CPUS") == 0) {
        return num_cpus;
    }
    if (num_cpus == 0) {
        num_cpus = 32;
    }
    num_threads = atoi(num_threads_str);
    if (num_threads < 0) {
        num_threads = 0;
    } else if (num_threads > 2 * num_cpus) {
        num_threads = 2 * num_cpus;
    }
    return num_threads;
}